

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

shared_ptr<Buffer> __thiscall QPDFWriter::getBufferSharedPointer(QPDFWriter *this)

{
  Buffer *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<Buffer> sVar1;
  
  __p = *(Buffer **)(*in_RSI + 0x30);
  *(undefined8 *)(*in_RSI + 0x30) = 0;
  std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Buffer,void>
            ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
QPDFWriter::getBufferSharedPointer()
{
    return std::shared_ptr<Buffer>(getBuffer());
}